

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void forlist(LexState *ls,TString *indexname)

{
  int base_00;
  int iVar1;
  int nexps;
  TString *pTVar2;
  int base;
  int line;
  int nvars;
  expdesc e;
  FuncState *fs;
  TString *indexname_local;
  LexState *ls_local;
  
  e._16_8_ = ls->fs;
  base_00 = ((FuncState *)e._16_8_)->freereg;
  pTVar2 = luaX_newstring(ls,"(for generator)",0xf);
  new_localvar(ls,pTVar2,0);
  pTVar2 = luaX_newstring(ls,"(for state)",0xb);
  new_localvar(ls,pTVar2,1);
  pTVar2 = luaX_newstring(ls,"(for control)",0xd);
  new_localvar(ls,pTVar2,2);
  new_localvar(ls,indexname,3);
  base = 4;
  while( true ) {
    iVar1 = testnext(ls,0x2c);
    if (iVar1 == 0) break;
    pTVar2 = str_checkname(ls);
    new_localvar(ls,pTVar2,base);
    base = base + 1;
  }
  checknext(ls,0x10b);
  iVar1 = ls->linenumber;
  nexps = explist1(ls,(expdesc *)&line);
  adjust_assign(ls,3,nexps,(expdesc *)&line);
  luaK_checkstack((FuncState *)e._16_8_,3);
  forbody(ls,base_00,iVar1,base + -3,0);
  return;
}

Assistant:

static void forlist(LexState*ls,TString*indexname){
FuncState*fs=ls->fs;
expdesc e;
int nvars=0;
int line;
int base=fs->freereg;
new_localvarliteral(ls,"(for generator)",nvars++);
new_localvarliteral(ls,"(for state)",nvars++);
new_localvarliteral(ls,"(for control)",nvars++);
new_localvar(ls,indexname,nvars++);
while(testnext(ls,','))
new_localvar(ls,str_checkname(ls),nvars++);
checknext(ls,TK_IN);
line=ls->linenumber;
adjust_assign(ls,3,explist1(ls,&e),&e);
luaK_checkstack(fs,3);
forbody(ls,base,line,nvars-3,0);
}